

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> *
cppqc::detail::
doShrink<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
           *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  bool bVar1;
  ostream *in_RCX;
  pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> *in_RDI;
  undefined8 in_XMM0_Qa;
  Input input;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  *__range3;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  shrinks;
  anon_class_16_2_431eb4e8 isTimeoutReached;
  time_point start;
  Input shrunk;
  size_t numShrinks;
  int in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> *this;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  long local_30;
  ostream *local_28;
  undefined8 local_10;
  
  local_30 = 0;
  this = in_RDI;
  local_28 = in_RCX;
  local_10 = in_XMM0_Qa;
  std::tuple<std::vector<int,_std::allocator<int>_>_>::tuple
            ((tuple<std::vector<int,_std::allocator<int>_>_> *)in_RDI,
             (tuple<std::vector<int,_std::allocator<int>_>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))));
  local_60 = std::chrono::_V2::steady_clock::now();
  local_58 = local_10;
  local_50 = local_60;
  do {
    Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
    ::shrinkInput((Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                   *)this,(Input *)in_RDI);
    local_90 = local_78;
    local_98._M_current =
         (tuple<std::vector<int,_std::allocator<int>_>_> *)
         std::
         vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
         ::begin((vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff2f,
                             CONCAT16(in_stack_ffffffffffffff2e,
                                      CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
                            ));
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
    ::end((vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff2f,
                                          CONCAT16(in_stack_ffffffffffffff2e,
                                                   CONCAT24(in_stack_ffffffffffffff2c,
                                                            in_stack_ffffffffffffff28)))), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::operator*(&local_98);
      std::tuple<std::vector<int,_std::allocator<int>_>_>::tuple
                ((tuple<std::vector<int,_std::allocator<int>_>_> *)in_RDI,
                 (tuple<std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,
                                   CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))));
      in_stack_ffffffffffffff2f =
           doShrink<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
           ::anon_class_16_2_431eb4e8::operator()
                     ((anon_class_16_2_431eb4e8 *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if ((bool)in_stack_ffffffffffffff2f) {
        std::operator<<(local_28,"Shrinking timed out...\n");
        in_stack_ffffffffffffff28 = 3;
      }
      else {
        in_stack_ffffffffffffff2e =
             Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
             ::checkInput((Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                           *)in_RDI,
                          (Input *)CONCAT17(in_stack_ffffffffffffff2f,
                                            CONCAT16(in_stack_ffffffffffffff2e,
                                                     CONCAT24(in_stack_ffffffffffffff2c,
                                                              in_stack_ffffffffffffff28))));
        if ((bool)in_stack_ffffffffffffff2e) {
          in_stack_ffffffffffffff28 = 0;
        }
        else {
          std::tuple<std::vector<int,_std::allocator<int>_>_>::operator=
                    ((tuple<std::vector<int,_std::allocator<int>_>_> *)in_RDI,
                     (type)CONCAT17(in_stack_ffffffffffffff2f,
                                    CONCAT16(in_stack_ffffffffffffff2e,
                                             CONCAT24(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28))));
          local_30 = local_30 + 1;
          in_stack_ffffffffffffff28 = 2;
        }
      }
      std::tuple<std::vector<int,_std::allocator<int>_>_>::~tuple
                ((tuple<std::vector<int,_std::allocator<int>_>_> *)0x127081);
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff28;
      if (in_stack_ffffffffffffff28 != 0) {
        if (in_stack_ffffffffffffff28 != 3) goto LAB_001270b1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::operator++(&local_98);
    }
    in_stack_ffffffffffffff44 = 0;
LAB_001270b1:
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (in_stack_ffffffffffffff44 == 0) {
      std::make_pair<unsigned_long&,std::tuple<std::vector<int,std::allocator<int>>>&>
                (&this->first,(tuple<std::vector<int,_std::allocator<int>_>_> *)in_RDI);
      std::tuple<std::vector<int,_std::allocator<int>_>_>::~tuple
                ((tuple<std::vector<int,_std::allocator<int>_>_> *)0x12711a);
      return this;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}